

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

void __thiscall
helics::TimeDependencies::resetDependency(TimeDependencies *this,GlobalFederateId gid)

{
  bool bVar1;
  pointer pDVar2;
  reference __dest;
  BaseType in_ESI;
  DependencyInfo *in_RDI;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  dep;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 local_98 [92];
  BaseType local_3c;
  DependencyInfo *local_38;
  DependencyInfo *local_28;
  DependencyInfo *local_20;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_18 [2];
  GlobalFederateId local_4;
  
  local_4.gid = in_ESI;
  local_20 = (DependencyInfo *)
             std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                       ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
                        in_RDI);
  local_28 = (DependencyInfo *)
             std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                       ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
                        in_RDI);
  local_18[0] = std::
                lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                          (local_20,local_28,&local_4);
  local_38 = (DependencyInfo *)
             std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                       ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)
                        in_RDI);
  bVar1 = __gnu_cxx::
          operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                    ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      *)in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pDVar2 = __gnu_cxx::
             __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator->(local_18);
    local_3c = local_4.gid;
    bVar1 = GlobalFederateId::operator==(&pDVar2->fedID,local_4);
    if ((bVar1) &&
       (pDVar2 = __gnu_cxx::
                 __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator->(local_18), (pDVar2->super_TimeData).mTimeState == time_granted)) {
      pDVar2 = __gnu_cxx::
               __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator->(local_18);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                        (&(pDVar2->super_TimeData).lastGrant,
                         (TimeRepresentation<count_time<9,_long>_> *)&cBigTime);
      if (bVar1) {
        pDVar2 = __gnu_cxx::
                 __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator->(local_18);
        DependencyInfo::DependencyInfo(in_RDI,(GlobalFederateId)(pDVar2->fedID).gid);
        __dest = __gnu_cxx::
                 __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator*(local_18);
        memcpy(__dest,local_98,0x54);
      }
    }
  }
  return;
}

Assistant:

void TimeDependencies::resetDependency(GlobalFederateId gid)
{
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep != dependencies.end()) {
        if (dep->fedID == gid) {
            if (dep->mTimeState == TimeState::time_granted && dep->lastGrant >= cBigTime) {
                *dep = DependencyInfo(dep->fedID);
            }
        }
    }
}